

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::ReadTrueTypeCollection
               (Buffer *file,uint8_t *data,size_t len,FontCollection *font_collection)

{
  bool bVar1;
  size_type __new_size;
  reference puVar2;
  __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_> local_d8
  ;
  reference local_d0;
  Font *font;
  iterator iStack_c0;
  uint offset_1;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  all_tables;
  iterator font_it;
  uint32_t local_5c;
  ulong uStack_58;
  uint32_t offset;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  uint32_t num_fonts;
  FontCollection *font_collection_local;
  size_t len_local;
  uint8_t *data_local;
  Buffer *file_local;
  
  bVar1 = Buffer::ReadU32(file,&font_collection->header_version);
  if ((bVar1) &&
     (bVar1 = Buffer::ReadU32(file,(uint32_t *)
                                   ((long)&offsets.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)),
     bVar1)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    for (uStack_58 = 0;
        uStack_58 <
        offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; uStack_58 = uStack_58 + 1) {
      bVar1 = Buffer::ReadU32(file,&local_5c);
      if (!bVar1) {
        file_local._7_1_ = false;
        goto LAB_00125e1d;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_5c);
    }
    __new_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    std::vector<woff2::Font,_std::allocator<woff2::Font>_>::resize
              (&font_collection->fonts,__new_size);
    all_tables._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<woff2::Font,_std::allocator<woff2::Font>_>::begin
                           (&font_collection->fonts);
    std::
    map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
    ::map((map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
           *)&__range1);
    __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    iStack_c0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff40), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
      font._4_4_ = *puVar2;
      Buffer::set_offset(file,(ulong)font._4_4_);
      local_d8 = __gnu_cxx::
                 __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                 ::operator++((__normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                               *)&all_tables._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
      local_d0 = __gnu_cxx::
                 __normal_iterator<woff2::Font_*,_std::vector<woff2::Font,_std::allocator<woff2::Font>_>_>
                 ::operator*(&local_d8);
      bVar1 = ReadCollectionFont(file,data,len,local_d0,
                                 (map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                                  *)&__range1);
      if (!bVar1) {
        file_local._7_1_ = false;
        goto LAB_00125e11;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end1);
    }
    file_local._7_1_ = true;
LAB_00125e11:
    std::
    map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
    ::~map((map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
            *)&__range1);
LAB_00125e1d:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadTrueTypeCollection(Buffer* file, const uint8_t* data, size_t len,
                            FontCollection* font_collection) {
    uint32_t num_fonts;

    if (!file->ReadU32(&font_collection->header_version) ||
        !file->ReadU32(&num_fonts)) {
      return FONT_COMPRESSION_FAILURE();
    }

    std::vector<uint32_t> offsets;
    for (size_t i = 0; i < num_fonts; i++) {
      uint32_t offset;
      if (!file->ReadU32(&offset)) {
        return FONT_COMPRESSION_FAILURE();
      }
      offsets.push_back(offset);
    }

    font_collection->fonts.resize(offsets.size());
    std::vector<Font>::iterator font_it = font_collection->fonts.begin();

    std::map<uint32_t, Font::Table*> all_tables;
    for (const auto offset : offsets) {
      file->set_offset(offset);
      Font& font = *font_it++;
      if (!ReadCollectionFont(file, data, len, &font, &all_tables)) {
        return FONT_COMPRESSION_FAILURE();
      }
    }

    return true;
}